

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O0

void select_u8x4(uint8_t *a,uint8_t *b,uint8_t *c,uint8_t *d,uint8_t *tab,uint32_t n)

{
  byte bVar1;
  byte bVar2;
  uint local_40;
  uint8_t item;
  uint32_t i;
  uint8_t mask;
  uint8_t rd;
  uint8_t rc;
  uint8_t rb;
  uint8_t ra;
  uint32_t n_local;
  uint8_t *tab_local;
  uint8_t *d_local;
  uint8_t *c_local;
  uint8_t *b_local;
  uint8_t *a_local;
  
  i._3_1_ = 0;
  i._2_1_ = 0;
  i._1_1_ = 0;
  i._0_1_ = 0;
  for (local_40 = 0; local_40 < n; local_40 = local_40 + 1) {
    bVar1 = tab[local_40];
    bVar2 = mask_u8((uint)*a,local_40);
    i._3_1_ = i._3_1_ & (bVar2 ^ 0xff) | bVar1 & bVar2;
    bVar2 = mask_u8((uint)*b,local_40);
    i._2_1_ = i._2_1_ & (bVar2 ^ 0xff) | bVar1 & bVar2;
    bVar2 = mask_u8((uint)*c,local_40);
    i._1_1_ = i._1_1_ & (bVar2 ^ 0xff) | bVar1 & bVar2;
    bVar2 = mask_u8((uint)*d,local_40);
    i._0_1_ = (byte)i & (bVar2 ^ 0xff) | bVar1 & bVar2;
  }
  *a = i._3_1_;
  *b = i._2_1_;
  *c = i._1_1_;
  *d = (byte)i;
  return;
}

Assistant:

static inline void select_u8x4(uint8_t *a, uint8_t *b, uint8_t *c, uint8_t *d,
                               volatile const uint8_t *tab, uint32_t n)
{
  uint8_t ra = 0,
          rb = 0,
          rc = 0,
          rd = 0;
  uint8_t mask;
  uint32_t i;

  for (i = 0; i < n; i++)
  {
    uint8_t item = tab[i];

    mask = mask_u8(*a, i); ra = (ra & ~mask) | (item & mask);
    mask = mask_u8(*b, i); rb = (rb & ~mask) | (item & mask);
    mask = mask_u8(*c, i); rc = (rc & ~mask) | (item & mask);
    mask = mask_u8(*d, i); rd = (rd & ~mask) | (item & mask);
  }

  *a = ra;
  *b = rb;
  *c = rc;
  *d = rd;
}